

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmCommand *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string errstring_1;
  undefined1 local_120 [8];
  string errstring;
  allocator local_d9;
  undefined1 local_d8 [8];
  string message;
  string local_b0;
  uint local_8c;
  int local_88;
  int relative;
  int skip;
  char ch3;
  char ch2;
  char ch1;
  string sdestdir;
  char *destdir;
  allocator local_41;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *destination;
  cmFileInstaller *this_local;
  
  local_20 = &(this->super_cmFileCopier).Destination;
  destination = (string *)this;
  uVar4 = std::__cxx11::string::size();
  if ((uVar4 < 2) && (bVar2 = std::operator!=(local_20,"/"), bVar2)) {
    pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,
               "called with inappropriate arguments. No DESTINATION provided or .",&local_41);
    cmCommand::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
    goto LAB_006abc6c;
  }
  pcVar5 = cmsys::SystemTools::GetEnv("DESTDIR");
  sdestdir.field_2._8_8_ = pcVar5;
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&skip,pcVar5,(allocator *)((long)&relative + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&relative + 3));
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&skip);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    relative._2_1_ = *pcVar5;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    relative._1_1_ = *pcVar5;
    relative._0_1_ = '\0';
    uVar4 = std::__cxx11::string::size();
    if (2 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
      relative._0_1_ = *pcVar5;
    }
    local_88 = 0;
    if (relative._2_1_ == '/') {
      if (relative._1_1_ != '/') goto LAB_006aba18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_d8,
                 "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
                 ,&local_d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::operator+=((string *)local_d8,(string *)local_20);
      cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,
                          (string *)local_d8);
      this_local._7_1_ = 0;
      message.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_d8);
    }
    else {
      if ((((relative._2_1_ < 'a') || ('z' < relative._2_1_)) &&
          ((relative._2_1_ < 'A' || ('Z' < relative._2_1_)))) || (relative._1_1_ != ':')) {
        local_8c = 1;
      }
      else {
        local_88 = 2;
        local_8c = (uint)((char)relative != '/');
      }
      if (local_8c == 0) {
LAB_006aba18:
        lVar6 = std::__cxx11::string::c_str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&errstring.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&skip,
                       (char *)(lVar6 + local_88));
        std::__cxx11::string::operator=
                  ((string *)local_20,(string *)(errstring.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(errstring.field_2._M_local_buf + 8));
        iVar3 = std::__cxx11::string::size();
        this->DestDirLength = iVar3;
        message.field_2._8_4_ = 0;
      }
      else {
        pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                   ,(allocator *)(message.field_2._M_local_buf + 0xf));
        cmCommand::SetError(pcVar1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
        message.field_2._8_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)&skip);
    if (message.field_2._8_4_ != 0) goto LAB_006abc6c;
  }
  if (*(int *)&(this->super_cmFileCopier).field_0xa4 != 6) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar5);
    if (!bVar2) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::MakeDirectory(pcVar5);
      if (!bVar2) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&errstring_1.field_2 + 8);
        std::operator+(__return_storage_ptr__,"cannot create directory: ",local_20);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,__return_storage_ptr__,". Maybe need administrative privileges.");
        std::__cxx11::string::~string((string *)(errstring_1.field_2._M_local_buf + 8));
        cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,
                            (string *)local_120);
        this_local._7_1_ = 0;
        message.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_120);
        goto LAB_006abc6c;
      }
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(local_20);
    if (!bVar2) {
      std::operator+(&local_180,"INSTALL destination: ",local_20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     &local_180," is not a directory.");
      std::__cxx11::string::~string((string *)&local_180);
      cmCommand::SetError(&((this->super_cmFileCopier).FileCommand)->super_cmCommand,
                          (string *)local_160);
      this_local._7_1_ = 0;
      message.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_160);
      goto LAB_006abc6c;
    }
  }
  this_local._7_1_ = 1;
LAB_006abc6c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if ( destination.size() < 2 && destination != "/" )
    {
    this->FileCommand->SetError("called with inappropriate arguments. "
        "No DESTINATION provided or .");
    return false;
    }

  const char* destdir = cmSystemTools::GetEnv("DESTDIR");
  if ( destdir && *destdir )
    {
    std::string sdestdir = destdir;
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if ( destination.size() > 2 )
      {
      ch3 = destination[2];
      }
    int skip = 0;
    if ( ch1 != '/' )
      {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
             ch2 == ':' )
        {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if ( ch3 != '/' )
          {
          relative = 1;
          }
        }
      else
        {
        relative = 1;
        }
      if ( relative )
        {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->FileCommand->SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
        }
      }
    else
      {
      if ( ch2 == '/' )
        {
        // looks like a network path.
        std::string message = "called with network path DESTINATION. This "
          "does not make sense when using DESTDIR. Specify local "
          "absolute path or remove DESTDIR environment variable."
          "\nDESTINATION=\n";
        message += destination;
        this->FileCommand->SetError(message);
        return false;
        }
      }
    destination = sdestdir + (destination.c_str() + skip);
    this->DestDirLength = int(sdestdir.size());
    }

  if(this->InstallType != cmInstallType_DIRECTORY)
    {
    if ( !cmSystemTools::FileExists(destination.c_str()) )
      {
      if ( !cmSystemTools::MakeDirectory(destination.c_str()) )
        {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->FileCommand->SetError(errstring);
        return false;
        }
      }
    if ( !cmSystemTools::FileIsDirectory(destination) )
      {
      std::string errstring = "INSTALL destination: " + destination +
        " is not a directory.";
      this->FileCommand->SetError(errstring);
      return false;
      }
    }
  return true;
}